

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# translate-sve.c
# Opt level: O0

_Bool trans_PTEST(DisasContext_conflict1 *s,arg_PTEST *a)

{
  TCGContext_conflict1 *tcg_ctx_00;
  _Bool _Var1;
  int dofs;
  int gofs_00;
  int iVar2;
  TCGv_i64 ret;
  TCGv_i64 ret_00;
  TCGv_i64 pg;
  TCGv_i64 pn;
  int words;
  int gofs;
  int nofs;
  TCGContext_conflict1 *tcg_ctx;
  arg_PTEST *a_local;
  DisasContext_conflict1 *s_local;
  
  tcg_ctx_00 = s->uc->tcg_ctx;
  _Var1 = sve_access_check_aarch64(s);
  if (_Var1) {
    dofs = pred_full_reg_offset(s,a->rn);
    gofs_00 = pred_full_reg_offset(s,a->pg);
    iVar2 = pred_full_reg_size(s);
    iVar2 = (iVar2 + 7) / 8;
    if (iVar2 == 1) {
      ret = tcg_temp_new_i64(tcg_ctx_00);
      ret_00 = tcg_temp_new_i64(tcg_ctx_00);
      tcg_gen_ld_i64_aarch64(tcg_ctx_00,ret,tcg_ctx_00->cpu_env,(long)dofs);
      tcg_gen_ld_i64_aarch64(tcg_ctx_00,ret_00,tcg_ctx_00->cpu_env,(long)gofs_00);
      do_predtest1(tcg_ctx_00,ret,ret_00);
      tcg_temp_free_i64(tcg_ctx_00,ret);
      tcg_temp_free_i64(tcg_ctx_00,ret_00);
    }
    else {
      do_predtest(s,dofs,gofs_00,iVar2);
    }
  }
  return true;
}

Assistant:

static bool trans_PTEST(DisasContext *s, arg_PTEST *a)
{
    TCGContext *tcg_ctx = s->uc->tcg_ctx;
    if (sve_access_check(s)) {
        int nofs = pred_full_reg_offset(s, a->rn);
        int gofs = pred_full_reg_offset(s, a->pg);
        int words = DIV_ROUND_UP(pred_full_reg_size(s), 8);

        if (words == 1) {
            TCGv_i64 pn = tcg_temp_new_i64(tcg_ctx);
            TCGv_i64 pg = tcg_temp_new_i64(tcg_ctx);

            tcg_gen_ld_i64(tcg_ctx, pn, tcg_ctx->cpu_env, nofs);
            tcg_gen_ld_i64(tcg_ctx, pg, tcg_ctx->cpu_env, gofs);
            do_predtest1(tcg_ctx, pn, pg);

            tcg_temp_free_i64(tcg_ctx, pn);
            tcg_temp_free_i64(tcg_ctx, pg);
        } else {
            do_predtest(s, nofs, gofs, words);
        }
    }
    return true;
}